

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

State * __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::pop(stack<c4::yml::Parser::State,_16UL> *this)

{
  bool bVar1;
  error_flags eVar2;
  long in_RDI;
  Location in_stack_00000000;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Location *in_stack_ffffffffffffffb0;
  char (*in_stack_fffffffffffffff0) [25];
  
  if (*(long *)(in_RDI + 0x988) == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,in_stack_ffffffffffffff98);
    error<25ul>(in_stack_fffffffffffffff0,in_stack_00000000);
  }
  *(long *)(in_RDI + 0x988) = *(long *)(in_RDI + 0x988) + -1;
  return (State *)(*(long *)(in_RDI + 0x980) + *(long *)(in_RDI + 0x988) * 0x98);
}

Assistant:

pop()
    {
        RYML_ASSERT(m_size > 0);
        --m_size;
        return m_stack[m_size];
    }